

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::extractLaneF32x4(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  undefined7 in_register_00000011;
  ulong uVar1;
  long lVar2;
  LaneArray<4> local_78;
  
  uVar1 = CONCAT71(in_register_00000011,index) & 0xffffffff;
  getLanesF32x4(&local_78,this);
  if ((byte)uVar1 < 4) {
    Literal(__return_storage_ptr__,local_78._M_elems + uVar1);
    lVar2 = 0x48;
    do {
      ~Literal((Literal *)((long)&local_78._M_elems[0].field_0 + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar1,4);
}

Assistant:

Literal Literal::extractLaneF32x4(uint8_t index) const {
  return getLanesF32x4().at(index);
}